

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O0

void jpeg_fdct_float(float *data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int ctr;
  float *dataptr;
  float z13;
  float z11;
  float z5;
  float z4;
  float z3;
  float z2;
  float z1;
  float tmp13;
  float tmp12;
  float tmp11;
  float tmp10;
  float tmp7;
  float tmp6;
  float tmp5;
  float tmp4;
  float tmp3;
  float tmp2;
  float tmp1;
  float tmp0;
  float *data_local;
  
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    fVar1 = *dataptr - dataptr[7];
    fVar6 = dataptr[6];
    fVar7 = dataptr[2];
    fVar5 = dataptr[4];
    fVar2 = *dataptr + dataptr[7] + dataptr[3] + dataptr[4];
    fVar3 = (*dataptr + dataptr[7]) - (dataptr[3] + dataptr[4]);
    fVar4 = dataptr[1] + dataptr[6] + dataptr[2] + dataptr[5];
    *dataptr = fVar2 + fVar4;
    dataptr[4] = fVar2 - fVar4;
    fVar2 = (((dataptr[1] + dataptr[6]) - (dataptr[2] + dataptr[5])) + fVar3) * 0.70710677;
    dataptr[2] = fVar3 + fVar2;
    dataptr[6] = fVar3 - fVar2;
    fVar5 = (dataptr[3] - fVar5) + (fVar7 - dataptr[5]);
    fVar2 = (dataptr[1] - fVar6) + fVar1;
    fVar3 = (fVar5 - fVar2) * 0.38268343;
    fVar5 = fVar5 * 0.5411961 + fVar3;
    fVar3 = fVar2 * 1.306563 + fVar3;
    fVar6 = ((fVar7 - dataptr[5]) + (dataptr[1] - fVar6)) * 0.70710677;
    fVar7 = fVar1 + fVar6;
    fVar1 = fVar1 - fVar6;
    dataptr[5] = fVar1 + fVar5;
    dataptr[3] = fVar1 - fVar5;
    dataptr[1] = fVar7 + fVar3;
    dataptr[7] = fVar7 - fVar3;
    dataptr = dataptr + 8;
  }
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    fVar1 = *dataptr - dataptr[0x38];
    fVar6 = dataptr[0x30];
    fVar7 = dataptr[0x10];
    fVar5 = dataptr[0x20];
    fVar2 = *dataptr + dataptr[0x38] + dataptr[0x18] + dataptr[0x20];
    fVar3 = (*dataptr + dataptr[0x38]) - (dataptr[0x18] + dataptr[0x20]);
    fVar4 = dataptr[8] + dataptr[0x30] + dataptr[0x10] + dataptr[0x28];
    *dataptr = fVar2 + fVar4;
    dataptr[0x20] = fVar2 - fVar4;
    fVar2 = (((dataptr[8] + dataptr[0x30]) - (dataptr[0x10] + dataptr[0x28])) + fVar3) * 0.70710677;
    dataptr[0x10] = fVar3 + fVar2;
    dataptr[0x30] = fVar3 - fVar2;
    fVar5 = (dataptr[0x18] - fVar5) + (fVar7 - dataptr[0x28]);
    fVar2 = (dataptr[8] - fVar6) + fVar1;
    fVar3 = (fVar5 - fVar2) * 0.38268343;
    fVar5 = fVar5 * 0.5411961 + fVar3;
    fVar3 = fVar2 * 1.306563 + fVar3;
    fVar6 = ((fVar7 - dataptr[0x28]) + (dataptr[8] - fVar6)) * 0.70710677;
    fVar7 = fVar1 + fVar6;
    fVar1 = fVar1 - fVar6;
    dataptr[0x28] = fVar1 + fVar5;
    dataptr[0x18] = fVar1 - fVar5;
    dataptr[8] = fVar7 + fVar3;
    dataptr[0x38] = fVar7 - fVar3;
    dataptr = dataptr + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float(FAST_FLOAT *data)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}